

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

Float __thiscall pbrt::Triangle::PDF(Triangle *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  Point3f *pPVar1;
  undefined1 auVar2 [16];
  initializer_list<float> v_00;
  initializer_list<pbrt::Point3<float>_> v_01;
  undefined1 auVar3 [16];
  bool bVar4;
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar5;
  int iVar6;
  Tuple3<pbrt::Normal3,_float> *this_00;
  long in_RSI;
  long in_RDI;
  long *in_FS_OFFSET;
  Float FVar7;
  type tVar8;
  float fVar9;
  undefined8 uVar21;
  undefined1 in_ZMM0 [64];
  undefined1 auVar22 [56];
  undefined1 auVar10 [64];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  Point3f PVar23;
  Vector3<float> VVar24;
  array<float,_4> w;
  Vector3f wi_1 [3];
  Point3f rp;
  Point2f u;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  int *v;
  TriangleMesh *mesh;
  Float pdf;
  Float pdf_1;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  Float solidAngle;
  Vector3<float> *in_stack_fffffffffffffb38;
  Vector3<float> *v_02;
  Interaction *in_stack_fffffffffffffb40;
  Tuple3<pbrt::Normal3,_float> *n;
  Point3<float> *in_stack_fffffffffffffb48;
  array<float,_4> *v_03;
  Point3<float> *in_stack_fffffffffffffb50;
  span<const_float> *this_01;
  Point3<float> *in_stack_fffffffffffffb58;
  Point3<float> *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  iterator in_stack_fffffffffffffb78;
  array<pbrt::Point3<float>,_3> *in_stack_fffffffffffffb80;
  ShapeSampleContext *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  span<const_float> in_stack_fffffffffffffb98;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  type local_3e8;
  float local_3e4;
  type local_3e0;
  float local_3dc;
  type local_3d8;
  float local_3d4;
  type local_3d0;
  float local_3cc;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  undefined1 local_2fc [12];
  undefined1 local_2f0 [16];
  Tuple3<pbrt::Normal3,_float> local_2e0;
  Tuple3<pbrt::Normal3,_float> local_2d0;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  float local_2a8;
  undefined8 local_2a0;
  float local_298;
  undefined8 local_294;
  float local_28c;
  undefined8 local_288;
  float local_280;
  undefined8 *local_278;
  undefined8 local_270;
  Vector3<float> local_264 [3];
  undefined8 local_240;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  int *local_208;
  TriangleMesh *local_200;
  Normal3<float> local_1f8;
  float local_1ec;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 in_stack_fffffffffffffe28;
  Float tMax;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  Triangle *in_stack_fffffffffffffe38;
  float local_18c;
  _lambda_pbrt__StatsAccumulator___1_ local_171;
  optional local_170 [96];
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  float local_4;
  undefined1 extraout_var_00 [56];
  
  tMax = (Float)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  auVar22 = in_ZMM0._8_56_;
  PVar23 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffffb40);
  auVar10._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar22;
  vmovlpd_avx(auVar10._0_16_);
  FVar7 = SolidAngle((Triangle *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (Point3f *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  if ((FVar7 < 0.0002) || (6.22 < FVar7)) {
    ShapeSampleContext::SpawnRay(in_stack_fffffffffffffb88,(Vector3f *)in_stack_fffffffffffffb80);
    Intersect(in_stack_fffffffffffffe38,
              (Ray *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),tMax);
    if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
       (iVar6 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)
                                     ::reg), iVar6 != 0)) {
      PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3_const&)_const::
      {lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer(&local_171);
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (AccumFunc)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
                 (PixelAccumFunc)in_stack_fffffffffffffb60);
      __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
    }
    *(long *)(*in_FS_OFFSET + -0x260) = *(long *)(*in_FS_OFFSET + -0x260) + 1;
    bVar4 = pstd::optional<pbrt::ShapeIntersection>::has_value
                      ((optional<pbrt::ShapeIntersection> *)local_170);
    if (!bVar4) {
      *(long *)(*in_FS_OFFSET + -0x268) = *(long *)(*in_FS_OFFSET + -0x268) + 1;
    }
    bVar4 = pstd::optional::operator_cast_to_bool(local_170);
    if (bVar4) {
      FVar7 = Area((Triangle *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      local_18c = 1.0 / FVar7;
      uVar21 = 0;
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x8232de);
      VVar24 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffb40);
      auVar3._8_8_ = uVar21;
      auVar3._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar3);
      tVar8 = AbsDot<float>((Normal3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      auVar22 = extraout_var;
      PVar23 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffffb40);
      auVar11._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar11._8_56_ = auVar22;
      uVar21 = 0;
      vmovlpd_avx(auVar11._0_16_);
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x8233e0);
      PVar23 = Interaction::p(in_stack_fffffffffffffb40);
      local_1e0 = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
      auVar2._8_8_ = uVar21;
      auVar2._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      local_1e8 = vmovlpd_avx(auVar2);
      fVar9 = DistanceSquared<float>(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      local_18c = local_18c / (tVar8 / fVar9);
      eVar5 = IsInf<float>(0.0);
      if (eVar5) {
        local_18c = 0.0;
      }
      local_4 = local_18c;
    }
    else {
      local_4 = 0.0;
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x8234d3);
  }
  else {
    local_1ec = 1.0 / FVar7;
    this_00 = (Tuple3<pbrt::Normal3,_float> *)(in_RSI + 0x24);
    auVar22 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    Normal3<float>::Normal3
              ((Normal3<float> *)in_stack_fffffffffffffb40,
               (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),SUB84(in_stack_fffffffffffffb38,0),
               0.0);
    bVar4 = Tuple3<pbrt::Normal3,_float>::operator!=(this_00,&local_1f8);
    if (bVar4) {
      local_200 = GetMesh((Triangle *)0x823556);
      local_208 = local_200->vertexIndices + *(int *)(in_RDI + 4) * 3;
      local_298 = local_200->p[*local_208].super_Tuple3<pbrt::Point3,_float>.z;
      pPVar1 = local_200->p + *local_208;
      local_2a0._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
      local_2a0._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      local_28c = local_200->p[local_208[1]].super_Tuple3<pbrt::Point3,_float>.z;
      pPVar1 = local_200->p + local_208[1];
      local_294._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
      local_294._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      local_280 = local_200->p[local_208[2]].super_Tuple3<pbrt::Point3,_float>.z;
      pPVar1 = local_200->p + local_208[2];
      local_288._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
      local_288._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      local_278 = &local_2a0;
      local_270 = 3;
      v_02 = local_264;
      v_01._M_len._0_4_ = in_stack_fffffffffffffb90;
      v_01._M_array = (iterator)in_stack_fffffffffffffb88;
      v_01._M_len._4_4_ = in_stack_fffffffffffffb94;
      local_238 = local_288;
      local_230 = local_280;
      local_228 = local_294;
      local_220 = local_28c;
      local_218 = local_2a0;
      local_210 = local_298;
      pstd::array<pbrt::Point3<float>,_3>::array(in_stack_fffffffffffffb80,v_01);
      PVar23 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffffb40);
      local_2b8 = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
      auVar12._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar12._8_56_ = auVar22;
      local_2c0 = vmovlpd_avx(auVar12._0_16_);
      local_2b0 = local_2c0;
      local_2a8 = local_2b8;
      auVar13._0_8_ =
           InvertSphericalTriangleSample
                     ((array<pbrt::Point3<float>,_3> *)in_stack_ffffffffffffff00,
                      (Point3f *)in_stack_fffffffffffffef8,(Vector3f *)in_stack_fffffffffffffef0);
      auVar13._8_56_ = extraout_var_00;
      local_240 = vmovlpd_avx(auVar13._0_16_);
      auVar22 = extraout_var_00;
      PVar23 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffffb40);
      local_2e0.z = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
      auVar14._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar14._8_56_ = auVar22;
      local_2e0._0_8_ = vmovlpd_avx(auVar14._0_16_);
      n = &local_2d0;
      local_2d0._0_8_ = local_2e0._0_8_;
      local_2d0.z = local_2e0.z;
      VVar24 = Point3<float>::operator-(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      auVar15._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar22;
      vmovlpd_avx(auVar15._0_16_);
      VVar24 = Normalize<float>((Vector3<float> *)this_00);
      auVar16._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar22;
      vmovlpd_avx(auVar16._0_16_);
      v_03 = (array<float,_4> *)local_2fc;
      VVar24 = Point3<float>::operator-(in_stack_fffffffffffffb50,(Point3<float> *)v_03);
      auVar17._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar22;
      vmovlpd_avx(auVar17._0_16_);
      VVar24 = Normalize<float>((Vector3<float> *)this_00);
      local_2fc._8_4_ = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar22;
      local_2fc._0_8_ = vmovlpd_avx(auVar18._0_16_);
      this_01 = (span<const_float> *)local_2f0;
      VVar24 = Point3<float>::operator-((Point3<float> *)this_01,(Point3<float> *)v_03);
      auVar19._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar22;
      vmovlpd_avx(auVar19._0_16_);
      VVar24 = Normalize<float>((Vector3<float> *)this_00);
      local_2f0._8_4_ = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar22;
      local_2f0._0_8_ = vmovlpd_avx(auVar20._0_16_);
      local_3cc = 0.01;
      local_3d0 = AbsDot<float>((Normal3<float> *)n,v_02);
      std::max<float>(&local_3cc,&local_3d0);
      local_3d4 = 0.01;
      local_3d8 = AbsDot<float>((Normal3<float> *)n,v_02);
      std::max<float>(&local_3d4,&local_3d8);
      local_3dc = 0.01;
      local_3e0 = AbsDot<float>((Normal3<float> *)n,v_02);
      std::max<float>(&local_3dc,&local_3e0);
      local_3e4 = 0.01;
      local_3e8 = AbsDot<float>((Normal3<float> *)n,v_02);
      std::max<float>(&local_3e4,&local_3e8);
      v_00._M_len = (size_type)in_stack_fffffffffffffb80;
      v_00._M_array = in_stack_fffffffffffffb78;
      pstd::array<float,_4>::array
                ((array<float,_4> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 v_00);
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>(this_01,v_03);
      FVar7 = BilinearPDF((Point2f)in_stack_fffffffffffffbac,in_stack_fffffffffffffb98);
      local_1ec = FVar7 * local_1ec;
    }
    local_4 = local_1ec;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
        Float solidAngle = SolidAngle(ctx.p());
        // Return PDF based on uniform area sampling for challenging triangles
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            CHECK_RARE(1e-6, !isect.has_value());
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }

        Float pdf = 1 / solidAngle;
        // Adjust PDF for warp product sampling of triangle $\cos \theta$ factor
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Get triangle vertices in _p0_, _p1_, and _p2_
            const TriangleMesh *mesh = GetMesh();
            const int *v = &mesh->vertexIndices[3 * triIndex];
            Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

            Point2f u = InvertSphericalTriangleSample({p0, p1, p2}, ctx.p(), wi);
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            pdf *= BilinearPDF(u, w);
        }

        return pdf;
    }